

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numberformatter.h
# Opt level: O3

bool __thiscall icu_63::number::impl::MacroProps::copyErrorTo(MacroProps *this,UErrorCode *status)

{
  UNumberCompactStyle UVar1;
  
  if ((this->notation).fType == NTN_ERROR) {
    UVar1 = (this->notation).fUnion.compactStyle;
  }
  else if ((this->precision).fType == RND_ERROR) {
    UVar1 = (this->precision).fUnion.currencyUsage;
  }
  else if ((this->padder).fWidth == -3) {
    UVar1 = (this->padder).fUnion.padding.fCp;
  }
  else if ((this->integerWidth).fHasError == true) {
    UVar1 = (this->integerWidth).fUnion.errorCode;
  }
  else if (((1 < (this->symbols).fType - SYMPTR_DFS) ||
           (UVar1 = 7, (this->symbols).fPtr.dfs != (DecimalFormatSymbols *)0x0)) &&
          (UVar1 = (this->scale).fError, UVar1 == UNUM_SHORT)) {
    return false;
  }
  *status = UVar1;
  return true;
}

Assistant:

UBool copyErrorTo(UErrorCode &status) const {
        if (fType == NTN_ERROR) {
            status = fUnion.errorCode;
            return TRUE;
        }
        return FALSE;
    }